

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::LargeHeapBlock::GetObjectHeader
          (LargeHeapBlock *this,void *objectAddress,LargeObjectHeader **ppHeader)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  LargeObjectHeader *pLVar4;
  LargeObjectHeader **ppLVar5;
  undefined8 *in_FS_OFFSET;
  uint index;
  LargeObjectHeader *header;
  LargeObjectHeader **ppHeader_local;
  void *objectAddress_local;
  LargeHeapBlock *this_local;
  
  *ppHeader = (LargeObjectHeader *)0x0;
  pLVar4 = GetHeader(this,objectAddress);
  if (pLVar4 < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = pLVar4->objectIndex;
    ppLVar5 = HeaderList(this);
    if (ppLVar5[uVar1] == pLVar4) {
      if (this->allocCount <= uVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x379,"(index < this->allocCount)","index < this->allocCount");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      *ppHeader = pLVar4;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
LargeHeapBlock::GetObjectHeader(void* objectAddress, LargeObjectHeader** ppHeader)
{
    (*ppHeader) = nullptr;

    LargeObjectHeader * header = GetHeader(objectAddress);
    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    Assert(index < this->allocCount);
    (*ppHeader) = header;
    return true;
}